

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O0

float get_pmin(float sum_loss,float t)

{
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  float in_XMM1_Da;
  float pmin;
  float avg_loss;
  undefined4 local_4;
  
  if (2.0 < in_XMM1_Da) {
    dVar1 = std::sqrt((double)(ulong)(uint)(in_XMM1_Da * (in_XMM0_Da / in_XMM1_Da)));
    dVar2 = std::log((double)(ulong)(uint)in_XMM1_Da);
    dVar1 = std::fmin((double)(ulong)(uint)(1.0 / (SUB84(dVar1,0) + SUB84(dVar2,0))),
                      5.2220990168286e-315);
    local_4 = SUB84(dVar1,0);
  }
  else {
    local_4 = 1.0;
  }
  return local_4;
}

Assistant:

float get_pmin(float sum_loss, float t)
{
  // t = ec.example_t - 1
  if (t <= 2.f)
  {
    return 1.f;
  }

  float avg_loss = sum_loss / t;
  float pmin = fmin(1.f / (sqrt(t * avg_loss) + log(t)), 0.5f);
  return pmin;  // treating n*eps_n = 1
}